

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

yyjson_mut_val *
duckdb_yyjson::unsafe_yyjson_mut_ptr_removex
          (yyjson_mut_val *val,char *ptr,size_t len,yyjson_ptr_ctx *ctx,yyjson_ptr_err *err)

{
  yyjson_mut_val *pyVar1;
  yyjson_mut_val *pyVar2;
  undefined8 uVar3;
  yyjson_mut_val *pyVar4;
  int iVar5;
  yyjson_mut_val *pyVar6;
  yyjson_ptr_ctx *pyVar7;
  ulong __n;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  yyjson_mut_val *key;
  ulong *puVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  yyjson_ptr_ctx cur_ctx;
  yyjson_ptr_ctx local_48;
  
  local_48.ctn = (yyjson_mut_val *)0x0;
  local_48.pre = (yyjson_mut_val *)0x0;
  local_48.old = (yyjson_mut_val *)0x0;
  pyVar7 = ctx;
  if (ctx == (yyjson_ptr_ctx *)0x0) {
    pyVar7 = &local_48;
  }
  pyVar6 = unsafe_yyjson_mut_ptr_getx(val,ptr,len,pyVar7,err);
  if (pyVar6 != (yyjson_mut_val *)0x0) {
    pyVar1 = pyVar7->ctn;
    if (pyVar1 != (yyjson_mut_val *)0x0) {
      uVar10 = pyVar1->tag;
      pyVar7 = ctx;
      if (ctx == (yyjson_ptr_ctx *)0x0) {
        pyVar7 = &local_48;
      }
      pyVar2 = pyVar7->pre;
      if ((~(uint)uVar10 & 7) == 0) {
        pyVar2 = pyVar2->next->next;
        if (((pyVar2 != (yyjson_mut_val *)0x0) && (((uint)pyVar2->tag & 7) == 5)) && (0xff < uVar10)
           ) {
          __n = pyVar2->tag >> 8;
          uVar9 = uVar10 >> 8;
          puVar11 = (ulong *)(pyVar1->uni).u64;
          uVar13 = 0;
          do {
            uVar15 = puVar11[2];
            puVar12 = *(ulong **)(uVar15 + 0x10);
            if (puVar12 == (ulong *)0x0) break;
            uVar14 = uVar13 + 1;
            if ((*puVar12 >> 8 == __n) &&
               (iVar5 = bcmp((void *)puVar12[1],(pyVar2->uni).ptr,__n), iVar5 == 0)) {
              uVar3 = *(undefined8 *)(puVar12[2] + 0x10);
              if (uVar14 == uVar9) {
                (pyVar1->uni).u64 = (uint64_t)puVar11;
                uVar15 = puVar11[2];
              }
              uVar9 = uVar9 - 1;
              uVar10 = uVar9 * 0x100 | uVar10 & 0xff;
              pyVar1->tag = uVar10;
              *(undefined8 *)(uVar15 + 0x10) = uVar3;
              puVar12 = puVar11;
              uVar14 = uVar13;
            }
            puVar11 = puVar12;
            uVar13 = uVar14;
          } while (uVar14 < uVar9);
        }
      }
      else if (pyVar2 != (yyjson_mut_val *)0x0) {
        pyVar4 = pyVar2->next;
        pyVar2->next = pyVar4->next;
        if ((yyjson_mut_val *)(pyVar1->uni).u64 == pyVar4) {
          (pyVar1->uni).u64 = (uint64_t)pyVar2;
        }
        lVar8 = (uVar10 >> 8) - 1;
        if (lVar8 == 0) {
          (pyVar1->uni).u64 = 0;
          uVar10 = uVar10 & 0xff;
        }
        else {
          uVar10 = lVar8 * 0x100 | uVar10 & 0xff;
        }
        pyVar1->tag = uVar10;
      }
    }
    pyVar7 = &local_48;
    if (ctx != (yyjson_ptr_ctx *)0x0) {
      pyVar7 = ctx;
    }
    pyVar7->pre = (yyjson_mut_val *)0x0;
    pyVar7->old = pyVar6;
  }
  return pyVar6;
}

Assistant:

yyjson_mut_val *unsafe_yyjson_mut_ptr_removex(yyjson_mut_val *val,
                                              const char *ptr,
                                              size_t len,
                                              yyjson_ptr_ctx *ctx,
                                              yyjson_ptr_err *err) {
    yyjson_mut_val *cur_val;
    yyjson_ptr_ctx cur_ctx;
    memset(&cur_ctx, 0, sizeof(cur_ctx));
    if (!ctx) ctx = &cur_ctx;
    cur_val = unsafe_yyjson_mut_ptr_getx(val, ptr, len, ctx, err);
    if (cur_val) {
        if (yyjson_mut_is_obj(ctx->ctn)) {
            yyjson_mut_val *key = ctx->pre->next->next;
            yyjson_mut_obj_put(ctx->ctn, key, NULL);
        } else {
            yyjson_ptr_ctx_remove(ctx);
        }
        ctx->pre = NULL;
        ctx->old = cur_val;
    }
    return cur_val;
}